

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_ostream.cpp
# Opt level: O0

string * __thiscall pretty_ostream::get_memory_usage_abi_cxx11_(pretty_ostream *this)

{
  int iVar1;
  ostream *poVar2;
  string *in_RDI;
  ostringstream memory_usage;
  double memory_usage_in_MB;
  rusage usage;
  allocator local_235 [17];
  int local_224;
  ostringstream local_220 [376];
  double local_a8;
  rusage local_a0;
  
  iVar1 = getrusage(RUSAGE_SELF,&local_a0);
  if (iVar1 == 0) {
    local_a8 = (double)local_a0.ru_maxrss * 0.0009765625;
    std::__cxx11::ostringstream::ostringstream(local_220);
    local_224 = (int)std::setprecision(4);
    poVar2 = std::operator<<((ostream *)local_220,(_Setprecision)local_224);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_a8);
    std::operator<<(poVar2," MB");
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_220);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,(char *)0x0,local_235);
    std::allocator<char>::~allocator((allocator<char> *)local_235);
  }
  return in_RDI;
}

Assistant:

string pretty_ostream::get_memory_usage() {
    struct rusage usage;
    if (getrusage(RUSAGE_SELF, &usage) == 0) {
        double memory_usage_in_MB = 0.0;
#ifdef APPLE
        memory_usage_in_MB = usage.ru_maxrss / 1024. / 1024.;  // MB in Apple
#else
        memory_usage_in_MB = usage.ru_maxrss / 1024.;  // MB in linux
#endif
        ostringstream memory_usage;
        memory_usage << setprecision(4) << memory_usage_in_MB << " MB";
        return (memory_usage.str());
    } else {
        return (0);
    }
}